

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialogPrivate::QFontDialogPrivate(QFontDialogPrivate *this)

{
  QDialogPrivate::QDialogPrivate(&this->super_QDialogPrivate);
  *(undefined ***)&(this->super_QDialogPrivate).super_QWidgetPrivate =
       &PTR__QFontDialogPrivate_007dd4e8;
  (this->style).d.size = 0;
  (this->style).d.d = (Data *)0x0;
  (this->style).d.ptr = (char16_t *)0x0;
  (this->family).d.d = (Data *)0x0;
  (this->family).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(this->family).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->family).d.size + 4) = 0;
  QFont::QFont(&this->selectedFont);
  QFontDialogOptions::create();
  (this->memberToDisconnectOnClose).d.d = (Data *)0x0;
  (this->memberToDisconnectOnClose).d.ptr = (char *)0x0;
  (this->receiverToDisconnectOnClose).wp.d = (Data *)0x0;
  (this->receiverToDisconnectOnClose).wp.value = (QObject *)0x0;
  (this->memberToDisconnectOnClose).d.size = 0;
  return;
}

Assistant:

QFontDialogPrivate::QFontDialogPrivate()
    : writingSystem(QFontDatabase::Any),
      options(QFontDialogOptions::create())
{
}